

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_benchmark.c
# Opt level: O0

int main(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  float cycle_per_op_9;
  uint64_t S_9;
  timespec ts_19;
  timespec ts_18;
  int i_7;
  int wrong_answer_7;
  uint64_t min_diff_7;
  uint64_t cycles_diff_9;
  uint64_t cycles_final_9;
  uint64_t cycles_start_9;
  float cycle_per_op_8;
  uint64_t S_8;
  timespec ts_17;
  timespec ts_16;
  int i_6;
  int wrong_answer_6;
  uint64_t min_diff_6;
  uint64_t cycles_diff_8;
  uint64_t cycles_final_8;
  uint64_t cycles_start_8;
  int x_3;
  int y;
  int length;
  int x_2;
  float cycle_per_op_7;
  uint64_t S_7;
  timespec ts_15;
  timespec ts_14;
  int i_5;
  int wrong_answer_5;
  uint64_t min_diff_5;
  uint64_t cycles_diff_7;
  uint64_t cycles_final_7;
  uint64_t cycles_start_7;
  float cycle_per_op_6;
  uint64_t S_6;
  timespec ts_13;
  timespec ts_12;
  int i_4;
  int wrong_answer_4;
  uint64_t min_diff_4;
  uint64_t cycles_diff_6;
  uint64_t cycles_final_6;
  uint64_t cycles_start_6;
  run_container_t *BO;
  int32_t inputsize;
  int x_1;
  run_container_t *B2;
  int x;
  run_container_t *B1;
  float cycle_per_op_5;
  uint64_t S_5;
  timespec ts_11;
  timespec ts_10;
  size_t j_2;
  int sum_1;
  uint64_t cycles_diff_5;
  uint64_t cycles_final_5;
  uint64_t cycles_start_5;
  float cycle_per_op_4;
  uint64_t S_4;
  timespec ts_9;
  timespec ts_8;
  size_t j_1;
  int sum;
  uint64_t cycles_diff_4;
  uint64_t cycles_final_4;
  uint64_t cycles_start_4;
  float cycle_per_op_3;
  uint64_t S_3;
  timespec ts_7;
  timespec ts_6;
  int i_3;
  int wrong_answer_3;
  uint64_t min_diff_3;
  uint64_t cycles_diff_3;
  uint64_t cycles_final_3;
  uint64_t cycles_start_3;
  uint32_t *out;
  int card;
  uint16_t *testvalues;
  size_t nbrtestvalues;
  int j;
  run_container_t *Bt;
  int howmany;
  float cycle_per_op_2;
  uint64_t S_2;
  timespec ts_5;
  timespec ts_4;
  int i_2;
  int wrong_answer_2;
  uint64_t min_diff_2;
  uint64_t cycles_diff_2;
  uint64_t cycles_final_2;
  uint64_t cycles_start_2;
  float cycle_per_op_1;
  uint64_t S_1;
  timespec ts_3;
  timespec ts_2;
  int i_1;
  int wrong_answer_1;
  uint64_t min_diff_1;
  uint64_t cycles_diff_1;
  uint64_t cycles_final_1;
  uint64_t cycles_start_1;
  int answer;
  float cycle_per_op;
  uint64_t S;
  timespec ts_1;
  timespec ts;
  int i;
  int wrong_answer;
  uint64_t min_diff;
  uint64_t cycles_diff;
  uint64_t cycles_final;
  uint64_t cycles_start;
  run_container_t *B;
  int size;
  int repeat;
  run_container_t *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  undefined2 in_stack_fffffffffffffb44;
  uint16_t in_stack_fffffffffffffb46;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  float local_4ac;
  float local_4a0;
  float local_498;
  float local_484;
  float local_47c;
  float local_470;
  float local_468;
  float local_454;
  float local_448;
  float local_43c;
  float local_434;
  float local_420;
  float local_418;
  float local_40c;
  float local_404;
  float local_3f8;
  float local_3f0;
  timespec local_3e0;
  timespec local_3d0;
  int local_3c0;
  int local_3bc;
  ulong local_3b8;
  ulong local_3b0;
  long local_3a8;
  long local_3a0;
  float local_394;
  ulong local_390;
  timespec local_388;
  timespec local_378;
  int local_368;
  int local_364;
  ulong local_360;
  ulong local_358;
  long local_350;
  long local_348;
  int local_33c;
  int local_338;
  int local_334;
  int local_330;
  float local_32c;
  ulong local_328;
  timespec local_320;
  timespec local_310;
  int local_300;
  int local_2fc;
  ulong local_2f8;
  ulong local_2f0;
  long local_2e8;
  long local_2e0;
  float local_2d4;
  ulong local_2d0;
  timespec local_2c8;
  timespec local_2b8;
  int local_2a8;
  int local_2a4;
  ulong local_2a0;
  ulong local_298;
  long local_290;
  long local_288;
  run_container_t *local_280;
  int local_278;
  int local_274;
  run_container_t *local_270;
  int local_264;
  run_container_t *local_260;
  float local_254;
  ulong local_250;
  timespec local_248;
  timespec local_238;
  ulong local_228;
  int local_21c;
  long local_218;
  long local_210;
  long local_208;
  float local_1fc;
  ulong local_1f8;
  timespec local_1f0;
  timespec local_1e0;
  ulong local_1d0;
  int local_1c4;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  float local_1a4;
  ulong local_1a0;
  timespec local_198;
  timespec local_188;
  int local_178;
  int local_174;
  ulong local_170;
  ulong local_168;
  long local_160;
  long local_158;
  void *local_150;
  int local_144;
  void *local_140;
  ulong local_138;
  int local_12c;
  run_container_t *local_128;
  int local_120;
  float local_11c;
  ulong local_118;
  timespec local_110;
  timespec local_100;
  int local_f0;
  int local_ec;
  ulong local_e8;
  ulong local_e0;
  long local_d8;
  long local_d0;
  float local_c4;
  ulong local_c0;
  timespec local_b8;
  timespec local_a8;
  int local_98;
  int local_94;
  ulong local_90;
  ulong local_88;
  long local_80;
  long local_78;
  uint local_70;
  float local_6c;
  ulong local_68;
  timespec local_60;
  timespec local_50;
  int local_40;
  int local_3c;
  ulong local_38;
  ulong local_30;
  long local_28;
  long local_20;
  run_container_t *local_18;
  int local_c;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_8 = 500;
  local_c = 0x800;
  tellmeall();
  printf("run container benchmarks\n");
  local_18 = run_container_create();
  printf("%s: ","add_test(B)");
  fflush((FILE *)0x0);
  local_38 = 0xffffffffffffffff;
  local_3c = 0;
  for (local_40 = 0; local_40 < local_8; local_40 = local_40 + 1) {
    clock_gettime(3,&local_50);
    local_20 = local_50.tv_sec * 1000000000 + local_50.tv_nsec;
    iVar1 = add_test((run_container_t *)
                     CONCAT26(in_stack_fffffffffffffb46,
                              CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)));
    if (iVar1 != 0) {
      local_3c = 1;
    }
    clock_gettime(3,&local_60);
    local_28 = local_60.tv_sec * 1000000000 + local_60.tv_nsec;
    local_30 = local_28 - local_20;
    if (local_30 < local_38) {
      local_38 = local_30;
    }
  }
  local_68 = (ulong)local_c;
  local_3f0 = (float)local_38;
  local_3f8 = (float)local_68;
  local_6c = local_3f0 / local_3f8;
  printf(" %.2f cycles per operation",(double)local_6c);
  if (local_3c != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  local_70 = contains_test((run_container_t *)
                           CONCAT26(in_stack_fffffffffffffb46,
                                    CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)));
  local_c = 0x10000;
  printf("%s: ","contains_test(B)");
  fflush((FILE *)0x0);
  local_90 = 0xffffffffffffffff;
  local_94 = 0;
  for (local_98 = 0; local_98 < local_8; local_98 = local_98 + 1) {
    clock_gettime(3,&local_a8);
    local_78 = local_a8.tv_sec * 1000000000 + local_a8.tv_nsec;
    iVar1 = contains_test((run_container_t *)
                          CONCAT26(in_stack_fffffffffffffb46,
                                   CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)));
    if (iVar1 != local_70) {
      local_94 = 1;
    }
    clock_gettime(3,&local_b8);
    local_80 = local_b8.tv_sec * 1000000000 + local_b8.tv_nsec;
    local_88 = local_80 - local_78;
    if (local_88 < local_90) {
      local_90 = local_88;
    }
  }
  local_c0 = (ulong)local_c;
  local_404 = (float)local_90;
  local_40c = (float)local_c0;
  local_c4 = local_404 / local_40c;
  printf(" %.2f cycles per operation",(double)local_c4);
  if (local_94 != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  local_c = 0x5555;
  printf("%s: ","remove_test(B)");
  fflush((FILE *)0x0);
  local_e8 = 0xffffffffffffffff;
  local_ec = 0;
  for (local_f0 = 0; local_f0 < local_8; local_f0 = local_f0 + 1) {
    clock_gettime(3,&local_100);
    local_d0 = local_100.tv_sec * 1000000000 + local_100.tv_nsec;
    iVar1 = remove_test((run_container_t *)
                        CONCAT26(in_stack_fffffffffffffb46,
                                 CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)));
    if (iVar1 != 0) {
      local_ec = 1;
    }
    clock_gettime(3,&local_110);
    local_d8 = local_110.tv_sec * 1000000000 + local_110.tv_nsec;
    local_e0 = local_d8 - local_d0;
    if (local_e0 < local_e8) {
      local_e8 = local_e0;
    }
  }
  local_118 = (ulong)local_c;
  local_418 = (float)local_e8;
  local_420 = (float)local_118;
  local_11c = local_418 / local_420;
  printf(" %.2f cycles per operation",(double)local_11c);
  if (local_ec != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  run_container_free((run_container_t *)0x10190b);
  for (local_120 = 0x20; local_120 < 0x10001; local_120 = local_120 << 3) {
    local_128 = run_container_create();
    for (local_12c = 0; local_12c < local_120; local_12c = local_12c + 1) {
      pcg32_random();
      run_container_add((run_container_t *)
                        CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                        in_stack_fffffffffffffb46);
    }
    local_138 = 0x400;
    local_140 = malloc(0x800);
    uVar2 = run_container_cardinality(in_stack_fffffffffffffb38);
    printf("\n number of values in container = %d\n",(ulong)uVar2);
    local_144 = run_container_cardinality(in_stack_fffffffffffffb38);
    local_150 = malloc((long)local_144 << 2);
    printf("%s: ","run_container_to_uint32_array(out, Bt, 1234)");
    fflush((FILE *)0x0);
    local_170 = 0xffffffffffffffff;
    local_174 = 0;
    for (local_178 = 0; local_178 < local_8; local_178 = local_178 + 1) {
      clock_gettime(3,&local_188);
      local_158 = local_188.tv_sec * 1000000000 + local_188.tv_nsec;
      iVar1 = run_container_to_uint32_array(local_150,local_128,0x4d2);
      if (iVar1 != local_144) {
        local_174 = 1;
      }
      clock_gettime(3,&local_198);
      local_160 = local_198.tv_sec * 1000000000 + local_198.tv_nsec;
      local_168 = local_160 - local_158;
      if (local_168 < local_170) {
        local_170 = local_168;
      }
    }
    local_1a0 = (ulong)local_144;
    local_434 = (float)local_170;
    local_43c = (float)local_1a0;
    local_1a4 = local_434 / local_43c;
    printf(" %.2f cycles per operation",(double)local_1a4);
    if (local_174 != 0) {
      printf(" [ERROR]");
    }
    printf("\n");
    fflush((FILE *)0x0);
    free(local_150);
    printf("%s %s: ","run_container_contains","run_cache_prefetch");
    fflush((FILE *)0x0);
    local_1c4 = 0;
    for (local_1d0 = 0; local_1d0 < local_138; local_1d0 = local_1d0 + 1) {
      run_cache_prefetch((run_container_t *)
                         CONCAT26(in_stack_fffffffffffffb46,
                                  CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)));
      clock_gettime(3,&local_1e0);
      local_1b0 = local_1e0.tv_sec * 1000000000 + local_1e0.tv_nsec;
      run_container_contains
                ((run_container_t *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 in_stack_fffffffffffffb46);
      clock_gettime(3,&local_1f0);
      local_1b8 = local_1f0.tv_sec * 1000000000 + local_1f0.tv_nsec;
      local_1c0 = local_1b8 - local_1b0;
      local_1c4 = local_1c4 + (int)local_1c0;
    }
    local_1f8 = local_138;
    local_448 = (float)local_138;
    local_1fc = (float)local_1c4 / local_448;
    printf(" %.2f cycles per operation",(double)local_1fc);
    printf("\n");
    fflush((FILE *)0x0);
    printf("%s %s: ","run_container_contains","run_cache_flush");
    fflush((FILE *)0x0);
    local_21c = 0;
    for (local_228 = 0; local_228 < local_138; local_228 = local_228 + 1) {
      run_cache_flush((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffb46,
                               CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)));
      clock_gettime(3,&local_238);
      local_208 = local_238.tv_sec * 1000000000 + local_238.tv_nsec;
      run_container_contains
                ((run_container_t *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 in_stack_fffffffffffffb46);
      clock_gettime(3,&local_248);
      local_210 = local_248.tv_sec * 1000000000 + local_248.tv_nsec;
      local_218 = local_210 - local_208;
      local_21c = local_21c + (int)local_218;
    }
    local_250 = local_138;
    local_454 = (float)local_138;
    local_254 = (float)local_21c / local_454;
    printf(" %.2f cycles per operation",(double)local_254);
    printf("\n");
    fflush((FILE *)0x0);
    free(local_140);
    run_container_free((run_container_t *)0x102024);
  }
  printf("\n");
  local_260 = run_container_create();
  for (local_264 = 0; local_264 < 0x10000; local_264 = local_264 + 3) {
    run_container_add((run_container_t *)
                      CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                      in_stack_fffffffffffffb46);
  }
  local_270 = run_container_create();
  for (local_274 = 0; local_274 < 0x10000; local_274 = local_274 + 5) {
    run_container_add((run_container_t *)
                      CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                      in_stack_fffffffffffffb46);
  }
  local_278 = local_260->n_runs + local_270->n_runs;
  local_280 = run_container_create();
  printf("\nUnion and intersections...\n");
  printf("\nNote:\n");
  printf("union times are expressed in cycles per number of input elements (both runs)\n");
  printf("intersection times are expressed in cycles per number of output elements\n\n");
  printf("==intersection and union test 1 \n");
  uVar2 = run_container_cardinality(in_stack_fffffffffffffb38);
  uVar3 = run_container_cardinality(in_stack_fffffffffffffb38);
  printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar2,(ulong)uVar3);
  local_70 = union_test((run_container_t *)
                        CONCAT26(in_stack_fffffffffffffb46,
                                 CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)),
                        in_stack_fffffffffffffb38,(run_container_t *)0x1021a3);
  printf("union cardinality = %d \n",(ulong)local_70);
  uVar2 = run_container_cardinality(in_stack_fffffffffffffb38);
  uVar3 = run_container_cardinality(in_stack_fffffffffffffb38);
  printf("B1 card = %d B2 card = %d \n",(ulong)uVar2,(ulong)uVar3);
  local_278 = local_260->n_runs + local_270->n_runs;
  printf("%s: ","union_test(B1, B2, BO)");
  fflush((FILE *)0x0);
  local_2a0 = 0xffffffffffffffff;
  local_2a4 = 0;
  for (local_2a8 = 0; local_2a8 < local_8; local_2a8 = local_2a8 + 1) {
    clock_gettime(3,&local_2b8);
    local_288 = local_2b8.tv_sec * 1000000000 + local_2b8.tv_nsec;
    uVar2 = union_test((run_container_t *)
                       CONCAT26(in_stack_fffffffffffffb46,
                                CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)),
                       in_stack_fffffffffffffb38,(run_container_t *)0x1022ad);
    if (uVar2 != local_70) {
      local_2a4 = 1;
    }
    clock_gettime(3,&local_2c8);
    local_290 = local_2c8.tv_sec * 1000000000 + local_2c8.tv_nsec;
    local_298 = local_290 - local_288;
    if (local_298 < local_2a0) {
      local_2a0 = local_298;
    }
  }
  local_2d0 = (ulong)local_278;
  local_468 = (float)local_2a0;
  local_470 = (float)local_2d0;
  local_2d4 = local_468 / local_470;
  printf(" %.2f cycles per operation",(double)local_2d4);
  if (local_2a4 != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  local_70 = intersection_test((run_container_t *)
                               CONCAT26(in_stack_fffffffffffffb46,
                                        CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40
                                                )),in_stack_fffffffffffffb38,
                               (run_container_t *)0x102461);
  printf("intersection cardinality = %d \n",(ulong)local_70);
  printf("%s: ","intersection_test(B1, B2, BO)");
  fflush((FILE *)0x0);
  local_2f8 = 0xffffffffffffffff;
  local_2fc = 0;
  for (local_300 = 0; local_300 < local_8; local_300 = local_300 + 1) {
    clock_gettime(3,&local_310);
    local_2e0 = local_310.tv_sec * 1000000000 + local_310.tv_nsec;
    uVar2 = intersection_test((run_container_t *)
                              CONCAT26(in_stack_fffffffffffffb46,
                                       CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                                      ),in_stack_fffffffffffffb38,(run_container_t *)0x10251e);
    if (uVar2 != local_70) {
      local_2fc = 1;
    }
    clock_gettime(3,&local_320);
    local_2e8 = local_320.tv_sec * 1000000000 + local_320.tv_nsec;
    local_2f0 = local_2e8 - local_2e0;
    if (local_2f0 < local_2f8) {
      local_2f8 = local_2f0;
    }
  }
  local_328 = (ulong)(int)local_70;
  local_47c = (float)local_2f8;
  local_484 = (float)local_328;
  local_32c = local_47c / local_484;
  printf(" %.2f cycles per operation",(double)local_32c);
  if (local_2fc != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  printf("==intersection and union test 2 \n");
  local_260->n_runs = 0;
  local_270->n_runs = 0;
  for (local_330 = 0; local_330 < 0x10000; local_330 = local_330 + 0x40) {
    local_334 = local_330 % 0xb;
    for (local_338 = 0; local_338 < local_334; local_338 = local_338 + 1) {
      run_container_add((run_container_t *)
                        CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                        in_stack_fffffffffffffb46);
    }
  }
  for (local_33c = 1; local_33c < 0x10000; local_33c = local_33c * 2) {
    run_container_add((run_container_t *)
                      CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                      in_stack_fffffffffffffb46);
  }
  uVar2 = run_container_cardinality(in_stack_fffffffffffffb38);
  uVar3 = run_container_cardinality(in_stack_fffffffffffffb38);
  printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar2,(ulong)uVar3);
  local_70 = union_test((run_container_t *)
                        CONCAT26(in_stack_fffffffffffffb46,
                                 CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)),
                        in_stack_fffffffffffffb38,(run_container_t *)0x102806);
  printf("union cardinality = %d \n",(ulong)local_70);
  uVar2 = run_container_cardinality(in_stack_fffffffffffffb38);
  uVar3 = run_container_cardinality(in_stack_fffffffffffffb38);
  printf("B1 card = %d B2 card = %d \n",(ulong)uVar2,(ulong)uVar3);
  local_278 = local_260->n_runs + local_270->n_runs;
  printf("%s: ","union_test(B1, B2, BO)");
  fflush((FILE *)0x0);
  local_360 = 0xffffffffffffffff;
  local_364 = 0;
  for (local_368 = 0; local_368 < local_8; local_368 = local_368 + 1) {
    clock_gettime(3,&local_378);
    local_348 = local_378.tv_sec * 1000000000 + local_378.tv_nsec;
    uVar2 = union_test((run_container_t *)
                       CONCAT26(in_stack_fffffffffffffb46,
                                CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)),
                       in_stack_fffffffffffffb38,(run_container_t *)0x102910);
    if (uVar2 != local_70) {
      local_364 = 1;
    }
    clock_gettime(3,&local_388);
    local_350 = local_388.tv_sec * 1000000000 + local_388.tv_nsec;
    local_358 = local_350 - local_348;
    if (local_358 < local_360) {
      local_360 = local_358;
    }
  }
  local_390 = (ulong)local_278;
  local_498 = (float)local_360;
  local_4a0 = (float)local_390;
  local_394 = local_498 / local_4a0;
  printf(" %.2f cycles per operation",(double)local_394);
  if (local_364 != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  local_70 = intersection_test((run_container_t *)
                               CONCAT26(in_stack_fffffffffffffb46,
                                        CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40
                                                )),in_stack_fffffffffffffb38,
                               (run_container_t *)0x102ac4);
  printf("intersection cardinality = %d \n",(ulong)local_70);
  printf("%s: ","intersection_test(B1, B2, BO)");
  fflush((FILE *)0x0);
  local_3b8 = 0xffffffffffffffff;
  local_3bc = 0;
  for (local_3c0 = 0; local_3c0 < local_8; local_3c0 = local_3c0 + 1) {
    clock_gettime(3,&local_3d0);
    local_3a0 = local_3d0.tv_sec * 1000000000 + local_3d0.tv_nsec;
    uVar2 = intersection_test((run_container_t *)
                              CONCAT26(in_stack_fffffffffffffb46,
                                       CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                                      ),in_stack_fffffffffffffb38,(run_container_t *)0x102b81);
    if (uVar2 != local_70) {
      local_3bc = 1;
    }
    clock_gettime(3,&local_3e0);
    local_3a8 = local_3e0.tv_sec * 1000000000 + local_3e0.tv_nsec;
    local_3b0 = local_3a8 - local_3a0;
    if (local_3b0 < local_3b8) {
      local_3b8 = local_3b0;
    }
  }
  local_4ac = (float)local_3b8;
  printf(" %.2f cycles per operation",(double)(local_4ac / (float)(ulong)(long)(int)local_70));
  if (local_3bc != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  run_container_free((run_container_t *)0x102d25);
  run_container_free((run_container_t *)0x102d32);
  run_container_free((run_container_t *)0x102d3f);
  return 0;
}

Assistant:

int main() {
    int repeat = 500;
    int size = TESTSIZE;
    tellmeall();
    printf("run container benchmarks\n");
    run_container_t* B = run_container_create();
    BEST_TIME(add_test(B), 0, repeat, size);
    int answer = contains_test(B);
    size = 1 << 16;
    BEST_TIME(contains_test(B), answer, repeat, size);
    size = (1 << 16) / 3;
    BEST_TIME(remove_test(B), 0, repeat, size);
    run_container_free(B);

    for (int howmany = 32; howmany <= (1 << 16); howmany *= 8) {
        run_container_t* Bt = run_container_create();
        for (int j = 0; j < howmany; ++j) {
            run_container_add(Bt, (uint16_t)pcg32_random());
        }
        size_t nbrtestvalues = 1024;
        uint16_t* testvalues = malloc(nbrtestvalues * sizeof(uint16_t));
        printf("\n number of values in container = %d\n",
               run_container_cardinality(Bt));
        int card = run_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned long)card);
        BEST_TIME(run_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_prefetch,
                            testvalues, nbrtestvalues);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_flush,
                            testvalues, nbrtestvalues);
        free(testvalues);
        run_container_free(Bt);
    }
    printf("\n");

    run_container_t* B1 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 3) {
        run_container_add(B1, (uint16_t)x);
    }
    run_container_t* B2 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 5) {
        run_container_add(B2, (uint16_t)x);
    }
    int32_t inputsize;
    inputsize = B1->n_runs + B2->n_runs;
    run_container_t* BO = run_container_create();
    printf("\nUnion and intersections...\n");
    printf("\nNote:\n");
    printf(
        "union times are expressed in cycles per number of input elements "
        "(both runs)\n");
    printf(
        "intersection times are expressed in cycles per number of output "
        "elements\n\n");
    printf("==intersection and union test 1 \n");
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;
    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);
    printf("==intersection and union test 2 \n");
    B1->n_runs = 0;
    B2->n_runs = 0;
    for (int x = 0; x < (1 << 16); x += 64) {
        int length = x % 11;
        for (int y = 0; y < length; ++y)
            run_container_add(B1, (uint16_t)(x + y));
    }
    for (int x = 1; x < 1 << 16; x += x) {
        run_container_add(B2, (uint16_t)x);
    }
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;

    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);

    run_container_free(B1);
    run_container_free(B2);
    run_container_free(BO);
    return 0;
}